

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fxch.c
# Opt level: O3

int Fxch_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nMaxDivExt,int fVerbose,int fVeryVerbose)

{
  int iDiv;
  int iVar1;
  Vec_Que_t *pVVar2;
  int *piVar3;
  float *pfVar4;
  int *piVar5;
  Vec_Wec_t *vCubes_00;
  int iVar6;
  Fxch_Man_t *pFxchMan;
  long lVar7;
  long lVar8;
  Fxch_Man_t *pFVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  timespec ts;
  timespec local_58;
  int local_44;
  long local_40;
  Vec_Wec_t *local_38;
  
  local_38 = vCubes;
  pFxchMan = Fxch_ManAlloc(vCubes);
  iVar6 = clock_gettime(3,&local_58);
  if (iVar6 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  Fxch_CubesGruping(pFxchMan);
  Fxch_ManMapLiteralsIntoCubes(pFxchMan,ObjIdMax);
  Fxch_ManGenerateLitHashKeys(pFxchMan);
  Fxch_ManComputeLevel(pFxchMan);
  Fxch_ManSCHashTablesInit(pFxchMan);
  Fxch_ManDivCreate(pFxchMan);
  iVar6 = clock_gettime(3,&local_58);
  if (iVar6 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  pFxchMan->timeInit = lVar8 + lVar7;
  if (fVeryVerbose != 0) {
    Fxch_ManPrintDivs(pFxchMan);
  }
  if (fVerbose != 0) {
    Fxch_ManPrintStats(pFxchMan);
  }
  iVar6 = clock_gettime(3,&local_58);
  if (iVar6 < 0) {
    local_40 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    local_40 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  local_44 = fVerbose;
  if (-1 < nMaxDivExt) {
    iVar6 = 0;
    do {
      pVVar2 = pFxchMan->vDivPrio;
      if (pVVar2->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      if (pVVar2->nSize == 1) break;
      piVar3 = pVVar2->pHeap;
      iDiv = piVar3[1];
      pfVar4 = *pVVar2->pCostsFlt;
      if (pfVar4 == (float *)0x0) {
        fVar15 = (float)iDiv;
      }
      else {
        fVar15 = pfVar4[iDiv];
      }
      if (fVar15 <= 0.0) break;
      piVar5 = pVVar2->pOrder;
      piVar5[iDiv] = -1;
      iVar10 = pVVar2->nSize;
      pVVar2->nSize = iVar10 + -1;
      if (iVar10 + -1 == 1) {
        piVar3[1] = -1;
      }
      else {
        iVar1 = piVar3[(long)iVar10 + -1];
        piVar3[(long)iVar10 + -1] = -1;
        piVar3[1] = iVar1;
        piVar5[iVar1] = 1;
        if (pfVar4 == (float *)0x0) {
          fVar15 = (float)iVar1;
        }
        else {
          fVar15 = pfVar4[iVar1];
        }
        iVar10 = pVVar2->nSize;
        uVar12 = 1;
        if (2 < iVar10) {
          uVar14 = 2;
          uVar12 = 1;
          do {
            uVar13 = uVar14 | 1;
            uVar11 = uVar14;
            if ((int)uVar13 < iVar10) {
              if (pfVar4 == (float *)0x0) {
                fVar16 = (float)piVar3[(int)uVar14];
                fVar17 = (float)piVar3[(int)uVar13];
              }
              else {
                fVar16 = pfVar4[piVar3[(int)uVar14]];
                fVar17 = pfVar4[piVar3[(int)uVar13]];
              }
              if (fVar16 < fVar17) {
                uVar11 = uVar13;
              }
            }
            if (iVar10 <= (int)uVar11) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar10 = piVar3[(int)uVar11];
            if (pfVar4 == (float *)0x0) {
              fVar16 = (float)iVar10;
            }
            else {
              fVar16 = pfVar4[iVar10];
            }
            if (fVar16 <= fVar15) break;
            piVar3[(int)uVar12] = iVar10;
            piVar5[iVar10] = uVar12;
            uVar14 = uVar11 * 2;
            iVar10 = pVVar2->nSize;
            uVar12 = uVar11;
          } while ((int)uVar14 < iVar10);
        }
        piVar3[(int)uVar12] = iVar1;
        piVar5[iVar1] = uVar12;
      }
      if (fVeryVerbose != 0) {
        Fxch_DivPrint(pFxchMan,iDiv);
      }
      Fxch_ManUpdate(pFxchMan,iDiv);
      iVar6 = iVar6 + 1;
    } while (iVar6 < nMaxDivExt || nMaxDivExt == 0);
  }
  iVar6 = clock_gettime(3,&local_58);
  vCubes_00 = local_38;
  if (iVar6 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  pFxchMan->timeExt = lVar7 + local_40;
  if (local_44 != 0) {
    pFVar9 = pFxchMan;
    Fxch_ManPrintStats(pFxchMan);
    lVar7 = pFxchMan->timeExt;
    lVar8 = pFxchMan->timeInit;
    iVar6 = (int)pFVar9;
    Abc_Print(iVar6,"%s =","\n[FXCH] Elapsed Time");
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar7 + lVar8) / 1000000.0);
    lVar7 = pFxchMan->timeInit;
    Abc_Print(iVar6,"%s =","[FXCH]    +-> Init");
    Abc_Print(iVar6,"%9.2f sec\n",(double)lVar7 / 1000000.0);
    lVar7 = pFxchMan->timeExt;
    Abc_Print(iVar6,"%s =","[FXCH]    +-> Extr");
    Abc_Print(iVar6,"%9.2f sec\n",(double)lVar7 / 1000000.0);
  }
  Fxch_CubesUnGruping(pFxchMan);
  Fxch_ManSCHashTablesFree(pFxchMan);
  Fxch_ManFree(pFxchMan);
  Vec_WecRemoveEmpty(vCubes_00);
  qsort(vCubes_00->pArray,(long)vCubes_00->nSize,0x10,Vec_WecSortCompare3);
  return 1;
}

Assistant:

int Fxch_FastExtract( Vec_Wec_t* vCubes,
                      int ObjIdMax,
                      int nMaxDivExt,
                      int fVerbose,
                      int fVeryVerbose )
{
    abctime TempTime;
    Fxch_Man_t* pFxchMan = Fxch_ManAlloc( vCubes );
    int i;

    TempTime = Abc_Clock();
    Fxch_CubesGruping( pFxchMan );
    Fxch_ManMapLiteralsIntoCubes( pFxchMan, ObjIdMax );
    Fxch_ManGenerateLitHashKeys( pFxchMan );
    Fxch_ManComputeLevel( pFxchMan );
    Fxch_ManSCHashTablesInit( pFxchMan );
    Fxch_ManDivCreate( pFxchMan );
    pFxchMan->timeInit = Abc_Clock() - TempTime;

    if ( fVeryVerbose )
        Fxch_ManPrintDivs( pFxchMan );

    if ( fVerbose )
        Fxch_ManPrintStats( pFxchMan );

    TempTime = Abc_Clock();
    
    for ( i = 0; (!nMaxDivExt || i < nMaxDivExt) && Vec_QueTopPriority( pFxchMan->vDivPrio ) > 0.0; i++ )
    {
        int iDiv = Vec_QuePop( pFxchMan->vDivPrio );

        if ( fVeryVerbose )
            Fxch_DivPrint( pFxchMan, iDiv );

        Fxch_ManUpdate( pFxchMan, iDiv );
    }
   
    pFxchMan->timeExt = Abc_Clock() - TempTime;

    if ( fVerbose )
    {
        Fxch_ManPrintStats( pFxchMan );
        Abc_PrintTime( 1, "\n[FXCH] Elapsed Time", pFxchMan->timeInit + pFxchMan->timeExt );
        Abc_PrintTime( 1, "[FXCH]    +-> Init", pFxchMan->timeInit );
        Abc_PrintTime( 1, "[FXCH]    +-> Extr", pFxchMan->timeExt );
    }

    Fxch_CubesUnGruping( pFxchMan );
    Fxch_ManSCHashTablesFree( pFxchMan );
    Fxch_ManFree( pFxchMan );

    Vec_WecRemoveEmpty( vCubes );
    Vec_WecSortByFirstInt( vCubes, 0 );

    return 1;
}